

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  undefined8 uVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  Result RVar6;
  ExprList *pEVar7;
  Expr *pEVar8;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var9;
  Location loc;
  int __flags;
  Expr *local_f0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  Expr *pEStack_e0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_d8;
  Expr *pEStack_d0;
  undefined1 local_c8 [32];
  undefined1 local_a8 [40];
  ExprList *local_80;
  _Head_base<0UL,_wabt::Expr_*,_false> local_78;
  _Head_base<0UL,_wabt::Expr_*,_false> local_70;
  _Head_base<0UL,_wabt::Expr_*,_false> local_68;
  _Head_base<0UL,_wabt::Expr_*,_false> local_60;
  Location local_58;
  
  TVar4 = Peek(this,0);
  RVar6.enum_ = Error;
  if (TVar4 != Lpar) {
    return (Result)Error;
  }
  TVar4 = Peek(this,1);
  if ((0x3e < TVar4 - AtomicFence) ||
     ((0x6ffeffbf7b3f7effU >> ((ulong)(TVar4 - AtomicFence) & 0x3f) & 1) == 0)) {
    GetToken((Token *)local_c8,this);
    local_58.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_c8._16_8_;
    local_58.field_1._8_8_ = local_c8._24_8_;
    local_58.filename.data_ = (char *)local_c8._0_8_;
    local_58.filename.size_ = local_c8._8_8_;
    TVar4 = Peek(this,1);
    if ((int)TVar4 < 0x53) {
      if (TVar4 != Block) {
        if (TVar4 != If) goto LAB_001665a7;
        Consume((Token *)local_c8,this);
        Consume((Token *)local_c8,this);
        MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&local_f0,&local_58);
        RVar5 = ParseLabelOpt(this,(string *)(local_f0 + 1));
        RVar6.enum_ = Error;
        if ((RVar5.enum_ != Error) &&
           (RVar5 = ParseBlockDeclaration(this,(BlockDeclaration *)&local_f0[1].loc.filename.size_),
           RVar5.enum_ != Error)) {
          bVar3 = PeekMatchExpr(this);
          if (bVar3) {
            local_c8._0_8_ = (Expr *)0x0;
            local_c8._8_8_ = (Expr *)0x0;
            local_c8._16_8_ = 0;
            RVar5 = ParseExpr(this,(ExprList *)local_c8);
            pEVar8 = (Expr *)local_c8._0_8_;
            if (RVar5.enum_ != Error) {
              pEStack_e0 = (Expr *)0x0;
              __flags = (int)(Expr *)local_c8;
              local_e8._M_head_impl = (Expr *)local_c8;
              intrusive_list<wabt::Expr>::splice
                        (exprs,(int)exprs,(__off64_t *)0x0,__flags,(__off64_t *)local_c8,
                         local_c8._0_8_,__flags);
              pEVar8 = (Expr *)local_c8._0_8_;
            }
            while (pEVar8 != (Expr *)0x0) {
              pEVar1 = (pEVar8->super_intrusive_list_base<wabt::Expr>).next_;
              (*(code *)(((Expr *)pEVar8->_vptr_Expr)->super_intrusive_list_base<wabt::Expr>).next_)
                        ();
              pEVar8 = pEVar1;
            }
            if (RVar5.enum_ == Error) goto LAB_00165f7a;
          }
          bVar3 = MatchLpar(this,Then);
          if (bVar3) {
            RVar5 = ParseTerminatingInstrList(this,(ExprList *)&local_f0[3].loc.filename.size_);
            if (RVar5.enum_ != Error) {
              GetToken((Token *)local_c8,this);
              local_d8.offset = local_c8._16_8_;
              pEStack_d0 = (Expr *)local_c8._24_8_;
              local_e8._M_head_impl = (Expr *)local_c8._0_8_;
              pEStack_e0 = (Expr *)local_c8._8_8_;
              local_f0[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_c8._16_8_;
              local_f0[4].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)local_c8._24_8_;
              *(undefined8 *)&local_f0[3].type_ = local_c8._0_8_;
              local_f0[4]._vptr_Expr = (_func_int **)local_c8._8_8_;
              RVar5 = Expect(this,Rpar);
              if (RVar5.enum_ != Error) {
                bVar3 = MatchLpar(this,Else);
                if (!bVar3) {
                  bVar3 = PeekMatchExpr(this);
                  if (bVar3) goto LAB_001664ba;
LAB_001664cb:
                  GetToken((Token *)local_c8,this);
                  local_d8.offset = local_c8._16_8_;
                  pEStack_d0 = (Expr *)local_c8._24_8_;
                  local_e8._M_head_impl = (Expr *)local_c8._0_8_;
                  pEStack_e0 = (Expr *)local_c8._8_8_;
                  local_f0[5]._vptr_Expr = (_func_int **)local_c8._16_8_;
                  local_f0[5].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_c8._24_8_;
                  *(undefined8 *)((long)&local_f0[4].loc.field_1 + 8) = local_c8._0_8_;
                  *(undefined8 *)&local_f0[4].type_ = local_c8._8_8_;
                  pEVar8 = local_f0;
LAB_00166501:
                  local_f0 = (Expr *)0x0;
                  local_70._M_head_impl = pEVar8;
                  intrusive_list<wabt::Expr>::push_back
                            (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                   &local_70);
                  if (local_70._M_head_impl != (Expr *)0x0) {
                    (*(code *)(((Expr *)(local_70._M_head_impl)->_vptr_Expr)->
                              super_intrusive_list_base<wabt::Expr>).next_)();
                  }
                  local_70._M_head_impl = (Expr *)0x0;
                  bVar3 = true;
                  _Var9._M_head_impl = local_f0;
                  goto LAB_00165e37;
                }
                RVar5 = ParseTerminatingInstrList(this,(ExprList *)&local_f0[4].loc);
                if (RVar5.enum_ != Error) {
                  RVar5 = Expect(this,Rpar);
                  goto LAB_001664c2;
                }
              }
            }
          }
          else {
            bVar3 = PeekMatchExpr(this);
            if (bVar3) {
              RVar5 = ParseExpr(this,(ExprList *)&local_f0[3].loc.filename.size_);
              if (RVar5.enum_ != Error) {
                GetToken((Token *)local_c8,this);
                local_d8.offset = local_c8._16_8_;
                pEStack_d0 = (Expr *)local_c8._24_8_;
                local_e8._M_head_impl = (Expr *)local_c8._0_8_;
                pEStack_e0 = (Expr *)local_c8._8_8_;
                local_f0[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_c8._16_8_;
                local_f0[4].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)local_c8._24_8_;
                *(undefined8 *)&local_f0[3].type_ = local_c8._0_8_;
                local_f0[4]._vptr_Expr = (_func_int **)local_c8._8_8_;
                bVar3 = PeekMatchExpr(this);
                pEVar8 = local_f0;
                if (!bVar3) goto LAB_00166501;
LAB_001664ba:
                RVar5 = ParseExpr(this,(ExprList *)&local_f0[4].loc);
LAB_001664c2:
                if (RVar5.enum_ != Error) goto LAB_001664cb;
              }
            }
            else {
              Match(this,Lpar);
              local_c8._0_8_ = (Expr *)(local_c8 + 0x10);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"then block","");
              local_e8._M_head_impl = (Expr *)0x0;
              pEStack_e0 = (Expr *)0x0;
              local_d8.offset = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_initialize<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_e8,(string *)local_c8,local_a8);
              RVar6 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&local_e8,"(then ...)");
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_e8);
              if ((Expr *)local_c8._0_8_ != (Expr *)(local_c8 + 0x10)) {
                operator_delete((void *)local_c8._0_8_);
              }
            }
          }
        }
LAB_00165f7a:
        bVar3 = false;
        _Var9._M_head_impl = local_f0;
        goto LAB_00165e37;
      }
      Consume((Token *)local_c8,this);
      Consume((Token *)local_c8,this);
      MakeUnique<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Location&>((wabt *)local_c8,&local_58)
      ;
      RVar6 = ParseLabelOpt(this,(string *)(local_c8._0_8_ + 0x40));
      if ((RVar6.enum_ != Error) &&
         (RVar6 = ParseBlock(this,(Block *)(local_c8._0_8_ + 0x40)), uVar2 = local_c8._0_8_,
         RVar6.enum_ != Error)) {
        local_c8._0_8_ = (Expr *)0x0;
        local_60._M_head_impl = (Expr *)uVar2;
        intrusive_list<wabt::Expr>::push_back
                  (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_60);
        if (local_60._M_head_impl != (Expr *)0x0) {
          (*(code *)(((Expr *)(local_60._M_head_impl)->_vptr_Expr)->
                    super_intrusive_list_base<wabt::Expr>).next_)();
        }
        local_60._M_head_impl = (Expr *)0x0;
        goto LAB_00166235;
      }
LAB_001661f2:
      bVar3 = false;
      pEVar8 = (Expr *)local_c8._0_8_;
    }
    else if (TVar4 == Loop) {
      Consume((Token *)local_c8,this);
      Consume((Token *)local_c8,this);
      MakeUnique<wabt::BlockExprBase<(wabt::ExprType)26>,wabt::Location&>
                ((wabt *)local_c8,&local_58);
      RVar6 = ParseLabelOpt(this,(string *)(local_c8._0_8_ + 0x40));
      if ((RVar6.enum_ == Error) ||
         (RVar6 = ParseBlock(this,(Block *)(local_c8._0_8_ + 0x40)), uVar2 = local_c8._0_8_,
         RVar6.enum_ == Error)) goto LAB_001661f2;
      local_c8._0_8_ = (Expr *)0x0;
      local_68._M_head_impl = (Expr *)uVar2;
      intrusive_list<wabt::Expr>::push_back
                (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_68);
      if (local_68._M_head_impl != (Expr *)0x0) {
        (*(code *)(((Expr *)(local_68._M_head_impl)->_vptr_Expr)->
                  super_intrusive_list_base<wabt::Expr>).next_)();
      }
      local_68._M_head_impl = (Expr *)0x0;
LAB_00166235:
      bVar3 = true;
      pEVar8 = (Expr *)local_c8._0_8_;
    }
    else {
      if (TVar4 != Try) {
LAB_001665a7:
        __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                      ,0xab8,"Result wabt::WastParser::ParseExpr(ExprList *)");
      }
      Consume((Token *)local_c8,this);
      Consume((Token *)local_c8,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)local_c8);
      MakeUnique<wabt::TryExpr,wabt::Location&>((wabt *)&local_f0,&local_58);
      RVar6 = ParseLabelOpt(this,(string *)(local_f0 + 1));
      if ((((RVar6.enum_ != Error) &&
           (RVar6 = ParseBlockDeclaration(this,(BlockDeclaration *)&local_f0[1].loc.filename.size_),
           RVar6.enum_ != Error)) && (RVar6 = Expect(this,Lpar), RVar6.enum_ != Error)) &&
         ((RVar6 = Expect(this,Do), RVar6.enum_ != Error &&
          (RVar6 = ParseInstrList(this,(ExprList *)&local_f0[3].loc.filename.size_),
          RVar6.enum_ != Error)))) {
        GetToken((Token *)local_c8,this);
        local_d8.offset = local_c8._16_8_;
        pEStack_d0 = (Expr *)local_c8._24_8_;
        local_e8._M_head_impl = (Expr *)local_c8._0_8_;
        pEStack_e0 = (Expr *)local_c8._8_8_;
        local_f0[4].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)local_c8._16_8_;
        local_f0[4].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)local_c8._24_8_;
        *(undefined8 *)&local_f0[3].type_ = local_c8._0_8_;
        local_f0[4]._vptr_Expr = (_func_int **)local_c8._8_8_;
        RVar6 = Expect(this,Rpar);
        if ((((RVar6.enum_ != Error) &&
             ((RVar6 = Expect(this,Lpar), RVar6.enum_ != Error &&
              (RVar6 = Expect(this,Catch), RVar6.enum_ != Error)))) &&
            (RVar6 = ParseTerminatingInstrList(this,(ExprList *)&local_f0[4].loc),
            RVar6.enum_ != Error)) &&
           (RVar6 = Expect(this,Rpar), pEVar8 = local_f0, RVar6.enum_ != Error)) {
          local_f0 = (Expr *)0x0;
          local_78._M_head_impl = pEVar8;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_78);
          if (local_78._M_head_impl != (Expr *)0x0) {
            (*(code *)(((Expr *)(local_78._M_head_impl)->_vptr_Expr)->
                      super_intrusive_list_base<wabt::Expr>).next_)();
          }
          local_78._M_head_impl = (Expr *)0x0;
          bVar3 = true;
          pEVar8 = local_f0;
          goto LAB_0016623d;
        }
      }
      bVar3 = false;
      pEVar8 = local_f0;
    }
LAB_0016623d:
    if (pEVar8 != (Expr *)0x0) {
      (*(code *)(((Expr *)pEVar8->_vptr_Expr)->super_intrusive_list_base<wabt::Expr>).next_)();
    }
    RVar6.enum_ = Error;
    goto LAB_00165e42;
  }
  Consume((Token *)local_c8,this);
  local_e8._M_head_impl = (Expr *)0x0;
  RVar5 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8
                         );
  if ((RVar5.enum_ == Error) || (RVar5 = ParseExprList(this,exprs), RVar5.enum_ == Error)) {
LAB_00165e2f:
    bVar3 = false;
    _Var9._M_head_impl = local_e8._M_head_impl;
  }
  else {
    local_c8._0_8_ = (Expr *)(local_c8 + 0x10);
    local_80 = exprs;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"an expr","");
    local_58.filename.data_ = (char *)0x0;
    local_58.filename.size_ = 0;
    local_58.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
               (string *)local_c8,local_a8);
    RVar5 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_58,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    if ((Expr *)local_c8._0_8_ != (Expr *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_);
    }
    _Var9._M_head_impl = local_e8._M_head_impl;
    if (RVar5.enum_ == Error) goto LAB_00165e2f;
    local_e8._M_head_impl = (Expr *)0x0;
    if ((((_Var9._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
       (((_Var9._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                    ,0x1bf,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar8 = local_80->last_;
    pEVar7 = local_80;
    if (pEVar8 != (Expr *)0x0) {
      ((_Var9._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar8;
      pEVar7 = (ExprList *)&pEVar8->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar7->first_ = _Var9._M_head_impl;
    local_80->last_ = _Var9._M_head_impl;
    (((Location *)&local_80->size_)->filename).data_ =
         (((Location *)&local_80->size_)->filename).data_ + 1;
    bVar3 = true;
    _Var9._M_head_impl = local_e8._M_head_impl;
  }
LAB_00165e37:
  if (_Var9._M_head_impl != (Expr *)0x0) {
    (*(code *)(((Expr *)(_Var9._M_head_impl)->_vptr_Expr)->super_intrusive_list_base<wabt::Expr>).
              next_)();
  }
LAB_00165e42:
  if (bVar3) {
    RVar6 = Expect(this,Rpar);
    RVar6.enum_ = (Enum)(RVar6.enum_ == Error);
  }
  return (Result)RVar6.enum_;
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = MakeUnique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = MakeUnique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = MakeUnique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = MakeUnique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        EXPECT(Lpar);
        EXPECT(Do);
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        EXPECT(Rpar);
        EXPECT(Lpar);
        EXPECT(Catch);
        CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
        EXPECT(Rpar);
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}